

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silnia.c
# Opt level: O0

void * callable_number(void *arg,size_t size,size_t *res_size)

{
  undefined8 local_38;
  longlong wynik;
  longlong liczba;
  arg_t *my_arg;
  size_t *res_size_local;
  size_t size_local;
  void *arg_local;
  
  *res_size = 8;
  local_38 = *arg;
  for (wynik = *arg; wynik <= *(long *)((long)arg + 8); wynik = wynik + 3) {
    local_38 = (void *)(wynik * (long)local_38);
  }
  return local_38;
}

Assistant:

void* callable_number(void* arg, size_t size, size_t* res_size) {
    *res_size = sizeof(long long);
    arg_t* my_arg = arg;
    long long liczba = my_arg->x;
    long long wynik = my_arg->x;
    while(liczba <= my_arg->limit) {
        wynik *= liczba;
        liczba += 3;
    }
    return (void *)wynik;
}